

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

MapinfoSpawnItem * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key,MapinfoSpawnItem *value)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_0045db33:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,key);
        (pNVar2->Pair).Value.classname.Index = (value->classname).Index;
        FString::AttachToOther(&(pNVar2->Pair).Value.filename,&value->filename);
      }
      else {
        (pNVar2->Pair).Value.classname.Index = (value->classname).Index;
        FString::operator=(&(pNVar2->Pair).Value.filename,&value->filename);
      }
      (pNVar2->Pair).Value.linenum = value->linenum;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_0045db33;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}